

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::Bilerp(Image *this,Point2f p,ImageChannelDesc *desc,WrapMode2D wrapMode)

{
  ulong uVar1;
  size_t sVar2;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_RDX;
  ImageChannelValues *in_RDI;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  int in_stack_0000003c;
  Image *in_stack_00000040;
  WrapMode2D in_stack_00000048;
  Tuple2<pbrt::Point2,_float> in_stack_00000050;
  int i;
  ImageChannelValues *cv;
  size_type in_stack_ffffffffffffff68;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  ImageChannelValues *in_stack_ffffffffffffff90;
  int local_30;
  
  FVar3 = (Float)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  vmovlpd_avx(in_ZMM0._0_16_);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(in_RDX);
  ImageChannelValues::ImageChannelValues(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,FVar3);
  local_30 = 0;
  while( true ) {
    uVar1 = (ulong)local_30;
    sVar2 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(in_RDX);
    if (sVar2 <= uVar1) break;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    FVar3 = BilerpChannel(in_stack_00000040,(Point2f)in_stack_00000050,in_stack_0000003c,
                          in_stack_00000048);
    in_stack_ffffffffffffff70 =
         (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
         InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    *(Float *)&((polymorphic_allocator<int> *)&in_stack_ffffffffffffff70->alloc)->memoryResource =
         FVar3;
    local_30 = local_30 + 1;
  }
  return in_RDI;
}

Assistant:

ImageChannelValues Image::Bilerp(Point2f p, const ImageChannelDesc &desc,
                                 WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    for (int i = 0; i < desc.offset.size(); ++i)
        cv[i] = BilerpChannel(p, desc.offset[i], wrapMode);
    return cv;
}